

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack16to1.h
# Opt level: O0

void ncnn::conv3x3s1_pack16to1_avx512
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  undefined1 auVar1 [64];
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined8 uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  long lVar18;
  long lVar19;
  long lVar20;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  float *pfVar21;
  long lVar22;
  long *in_RDI;
  undefined1 auVar23 [32];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  float fVar27;
  float fVar28;
  __m512 _sum;
  __m512 _r22;
  __m512 _r21;
  __m512 _r20;
  __m512 _r12;
  __m512 _r11;
  __m512 _r10;
  __m512 _sum2;
  __m512 _sum1;
  __m512 _sum0;
  __m512 _r02;
  __m512 _r01;
  __m512 _r00;
  int j;
  float *r2;
  float *r1;
  float *r0;
  int i_1;
  __m512 _k22;
  __m512 _k21;
  __m512 _k20;
  __m512 _k12;
  __m512 _k11;
  __m512 _k10;
  __m512 _k02;
  __m512 _k01;
  __m512 _k00;
  Mat img0;
  float *outptr0;
  int q;
  float *k0;
  float bias0;
  Mat out0;
  int p;
  int remain_outch_start;
  float *bias;
  int outch;
  int outh;
  int outw;
  int inch;
  Mat *m;
  Mat *m_2;
  Mat *m_1;
  int i;
  float *ptr;
  int size;
  __m128 x32;
  __m128 x64;
  __m128 x128;
  __m256 x256;
  float local_13dc;
  int local_1064;
  undefined1 (*local_1060) [64];
  undefined1 (*local_1058) [64];
  undefined1 (*local_1050) [64];
  int local_1044;
  float *local_d90;
  int local_d84;
  undefined1 (*local_d38) [64];
  int local_cd8;
  int local_cd0;
  int local_334;
  float *local_330;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  float local_200;
  float fStack_1fc;
  float local_1e0;
  float fStack_1dc;
  float fStack_1d8;
  float fStack_1d4;
  
  lVar18 = in_RDI[7];
  iVar2 = *(int *)((long)in_RSI + 0x2c);
  lVar19 = in_RSI[6];
  lVar20 = in_RSI[7];
  lVar4 = *in_RCX;
  for (local_cd0 = 0; local_cd0 < (int)lVar20; local_cd0 = local_cd0 + 1) {
    iVar3 = *(int *)((long)in_RSI + 0x34);
    pfVar21 = (float *)(*in_RSI + in_RSI[8] * (long)local_cd0 * in_RSI[2]);
    local_cd8 = (int)(((long)*(int *)((long)in_RSI + 0x2c) * (long)(int)in_RSI[6] * in_RSI[2] + 0xfU
                      & 0xfffffffffffffff0) / (ulong)in_RSI[2]);
    if ((int)in_RSI[5] == 4) {
      local_cd8 = *(int *)((long)in_RSI + 0x2c) * (int)in_RSI[6];
    }
    if (lVar4 == 0) {
      local_13dc = 0.0;
    }
    else {
      local_13dc = *(float *)(lVar4 + (long)local_cd0 * 4);
    }
    local_330 = pfVar21;
    for (local_334 = 0; local_334 < local_cd8 * iVar3; local_334 = local_334 + 1) {
      *local_330 = local_13dc;
      local_330 = local_330 + 1;
    }
    local_d38 = (undefined1 (*) [64])(*in_RDX + in_RDX[8] * (long)local_cd0 * in_RDX[2]);
    for (local_d84 = 0; local_d84 < (int)lVar18; local_d84 = local_d84 + 1) {
      iVar3 = *(int *)((long)in_RDI + 0x2c);
      lVar22 = *in_RDI + in_RDI[8] * (long)local_d84 * in_RDI[2];
      lVar5 = in_RDI[2];
      auVar10 = *local_d38;
      auVar11 = local_d38[1];
      auVar12 = local_d38[2];
      auVar13 = local_d38[3];
      auVar14 = local_d38[4];
      auVar15 = local_d38[5];
      auVar16 = local_d38[6];
      auVar17 = local_d38[7];
      auVar1 = local_d38[8];
      local_d90 = pfVar21;
      for (local_1044 = 0; local_1044 < (int)lVar19; local_1044 = local_1044 + 1) {
        local_1050 = (undefined1 (*) [64])(lVar22 + (long)iVar3 * (long)local_1044 * lVar5);
        local_1058 = (undefined1 (*) [64])(lVar22 + (long)iVar3 * (long)(local_1044 + 1) * lVar5);
        local_1060 = (undefined1 (*) [64])(lVar22 + (long)iVar3 * (long)(local_1044 + 2) * lVar5);
        for (local_1064 = 0; local_1064 < iVar2; local_1064 = local_1064 + 1) {
          auVar24 = vmulps_avx512f(auVar10,*local_1050);
          auVar25 = vmulps_avx512f(auVar11,local_1050[1]);
          auVar26 = vmulps_avx512f(auVar12,local_1050[2]);
          auVar24 = vfmadd213ps_avx512f(*local_1058,auVar13,auVar24);
          auVar25 = vfmadd213ps_avx512f(local_1058[1],auVar14,auVar25);
          auVar26 = vfmadd213ps_avx512f(local_1058[2],auVar15,auVar26);
          auVar24 = vfmadd213ps_avx512f(*local_1060,auVar16,auVar24);
          auVar25 = vfmadd213ps_avx512f(local_1060[1],auVar17,auVar25);
          auVar26 = vfmadd213ps_avx512f(local_1060[2],auVar1,auVar26);
          auVar25 = vaddps_avx512f(auVar25,auVar26);
          auVar24 = vaddps_avx512f(auVar24,auVar25);
          auVar23 = vextractf64x4_avx512f(auVar24,1);
          fStack_210 = auVar24._16_4_;
          fStack_20c = auVar24._20_4_;
          fStack_208 = auVar24._24_4_;
          fStack_204 = auVar24._28_4_;
          fStack_230 = auVar23._16_4_;
          fStack_22c = auVar23._20_4_;
          fStack_228 = auVar23._24_4_;
          fStack_224 = auVar23._28_4_;
          fVar27 = fStack_210 + fStack_230 + local_1e0;
          fVar28 = fStack_20c + fStack_22c + fStack_1dc;
          uVar7 = CONCAT44(fVar28,fVar27);
          uVar8 = CONCAT44(fStack_204 + fStack_224 + fStack_1d4,fStack_208 + fStack_228 + fStack_1d8
                          );
          auVar9._8_8_ = uVar8;
          auVar9._0_8_ = uVar7;
          auVar6._8_8_ = uVar8;
          auVar6._0_8_ = uVar7;
          auVar6 = vunpckhpd_avx(auVar6,auVar9);
          local_200 = auVar6._0_4_;
          fStack_1fc = auVar6._4_4_;
          *local_d90 = fVar27 + local_200 + fVar28 + fStack_1fc + *local_d90;
          local_d90 = local_d90 + 1;
          local_1050 = local_1050 + 1;
          local_1058 = local_1058 + 1;
          local_1060 = local_1060 + 1;
        }
      }
      local_d38 = local_d38 + 9;
    }
  }
  return;
}

Assistant:

static void conv3x3s1_pack16to1_avx512(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int inch = bottom_blob.c;
    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const float* bias = _bias;

    int remain_outch_start = 0;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = remain_outch_start; p < outch; p++)
    {
        Mat out0 = top_blob.channel(p);

        const float bias0 = bias ? bias[p] : 0.f;
        out0.fill(bias0);

        const float* k0 = kernel.channel(p);

        for (int q = 0; q < inch; q++)
        {
            float* outptr0 = out0.row(0);

            const Mat img0 = bottom_blob.channel(q);

            __m512 _k00 = _mm512_loadu_ps(k0);
            __m512 _k01 = _mm512_loadu_ps(k0 + 16);
            __m512 _k02 = _mm512_loadu_ps(k0 + 16 * 2);
            __m512 _k10 = _mm512_loadu_ps(k0 + 16 * 3);
            __m512 _k11 = _mm512_loadu_ps(k0 + 16 * 4);
            __m512 _k12 = _mm512_loadu_ps(k0 + 16 * 5);
            __m512 _k20 = _mm512_loadu_ps(k0 + 16 * 6);
            __m512 _k21 = _mm512_loadu_ps(k0 + 16 * 7);
            __m512 _k22 = _mm512_loadu_ps(k0 + 16 * 8);

            int i = 0;

            for (; i < outh; i++)
            {
                const float* r0 = img0.row(i);
                const float* r1 = img0.row(i + 1);
                const float* r2 = img0.row(i + 2);

                int j = 0;
                for (; j < outw; j++)
                {
                    __m512 _r00 = _mm512_loadu_ps(r0);
                    __m512 _r01 = _mm512_loadu_ps(r0 + 16);
                    __m512 _r02 = _mm512_loadu_ps(r0 + 32);

                    __m512 _sum0 = _mm512_mul_ps(_k00, _r00);
                    __m512 _sum1 = _mm512_mul_ps(_k01, _r01);
                    __m512 _sum2 = _mm512_mul_ps(_k02, _r02);

                    __m512 _r10 = _mm512_loadu_ps(r1);
                    __m512 _r11 = _mm512_loadu_ps(r1 + 16);
                    __m512 _r12 = _mm512_loadu_ps(r1 + 32);

                    _sum0 = _mm512_fmadd_ps(_k10, _r10, _sum0);
                    _sum1 = _mm512_fmadd_ps(_k11, _r11, _sum1);
                    _sum2 = _mm512_fmadd_ps(_k12, _r12, _sum2);

                    __m512 _r20 = _mm512_loadu_ps(r2);
                    __m512 _r21 = _mm512_loadu_ps(r2 + 16);
                    __m512 _r22 = _mm512_loadu_ps(r2 + 32);

                    _sum0 = _mm512_fmadd_ps(_k20, _r20, _sum0);
                    _sum1 = _mm512_fmadd_ps(_k21, _r21, _sum1);
                    _sum2 = _mm512_fmadd_ps(_k22, _r22, _sum2);

                    __m512 _sum = _mm512_add_ps(_sum0, _mm512_add_ps(_sum1, _sum2));

                    *outptr0 += _mm512_comp_reduce_add_ps(_sum);
                    outptr0++;
                    r0 += 16;
                    r1 += 16;
                    r2 += 16;
                }
            }

            k0 += 9 * 16;
        }
    }
}